

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O0

void __thiscall
amrex::MLNodeLaplacian::normalize(MLNodeLaplacian *this,int amrlev,int mglev,MultiFab *mf)

{
  int iVar1;
  bool bVar2;
  Geometry *this_00;
  double *pdVar3;
  MFIter *in_RCX;
  long lVar4;
  int in_EDX;
  long in_RDI;
  double extraout_XMM0_Qa;
  int i_2;
  int j_2;
  int k_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  Array4<const_double> *sarr;
  int i_1;
  int j_1;
  int k_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Array4<const_double> *szarr;
  Array4<const_double> *syarr;
  Array4<const_double> *sxarr;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *stenarr;
  Array4<const_int> *dmskarr;
  Array4<double> *arr;
  Box *bx;
  MFIter mfi;
  Real s0_norm0;
  iMultiFab *dmsk;
  GpuArray<double,_3U> dxinv;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *stencil;
  array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL> *sigma;
  Real facz;
  Real facy;
  Real facx;
  Real fxyz;
  Real facz_1;
  Real facy_1;
  Real facx_1;
  nullptr_t in_stack_fffffffffffff478;
  MFIter *in_stack_fffffffffffff480;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff488;
  undefined8 in_stack_fffffffffffff4a0;
  undefined1 do_tiling_;
  long *plVar5;
  FabArrayBase *in_stack_fffffffffffff4a8;
  Ref *pRVar6;
  int local_b3c;
  int local_b38;
  int local_b34;
  undefined4 in_stack_fffffffffffff4e0;
  int in_stack_fffffffffffff4e4;
  MFIter local_af0;
  int local_a90;
  Vector<int,_std::allocator<int>_> *local_a84;
  int local_a7c;
  undefined8 local_a78;
  int local_a70;
  undefined8 local_a68;
  int local_a60;
  long local_a58 [8];
  long *local_a18;
  long local_a10 [8];
  long *local_9d0;
  undefined1 local_9c8 [216];
  RefID local_8f0;
  long local_8e8 [8];
  long *local_8a8;
  undefined1 local_8a0 [64];
  _Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false> local_860;
  int local_854 [7];
  int *local_838;
  MFIter local_830;
  double local_7d0;
  type local_7c8;
  GpuArray<double,_3U> local_7c0;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *local_7a8;
  array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL> *local_7a0;
  MFIter *local_798;
  int local_790;
  undefined8 local_780;
  int local_778;
  int *local_770;
  int local_764;
  int iStack_760;
  int local_75c;
  undefined8 local_758;
  int local_750;
  int *local_748;
  int local_73c;
  int iStack_738;
  int local_734;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_730;
  int local_728;
  int *local_720;
  int local_714;
  int iStack_710;
  int local_70c;
  undefined8 local_708;
  int local_700;
  int *local_6f8;
  int local_6ec;
  int iStack_6e8;
  int local_6e4;
  Vector<int,_std::allocator<int>_> *local_6e0;
  int local_6d8;
  int *local_6d0;
  int local_6c4;
  int iStack_6c0;
  int local_6bc;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6b8;
  int local_6b0;
  int *local_6a8;
  int local_69c;
  int iStack_698;
  int local_694;
  double local_690;
  long *local_688;
  Ref *local_680;
  FBData<amrex::FArrayBox> *local_678;
  int local_670;
  int local_66c;
  int local_668;
  int local_664;
  int local_660;
  int local_65c;
  long *local_658;
  int local_64c;
  int local_648;
  int local_644;
  FBData<amrex::FArrayBox> *local_640;
  double local_638;
  double local_630;
  double local_628;
  GpuArray<double,_3U> *local_620;
  long *local_618;
  long *local_610;
  long *local_608;
  FabArray<amrex::FArrayBox> *local_600;
  _Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false> local_5f8;
  int local_5f0;
  int local_5ec;
  int local_5e8;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  long *local_5d8;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  long *local_5c0;
  int local_5b4;
  int local_5b0;
  int local_5ac;
  long *local_5a8;
  int local_59c;
  int local_598;
  int local_594;
  long *local_590;
  int local_584;
  int local_580;
  int local_57c;
  long *local_578;
  int local_56c;
  int local_568;
  int local_564;
  long *local_560;
  int local_554;
  int local_550;
  int local_54c;
  long *local_548;
  int local_53c;
  int local_538;
  int local_534;
  long *local_530;
  int local_524;
  int local_520;
  int local_51c;
  long *local_518;
  int local_50c;
  int local_508;
  int local_504;
  long *local_500;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  long *local_4e8;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  long *local_4d0;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  long *local_4b8;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  long *local_4a0;
  int local_494;
  int local_490;
  int local_48c;
  long *local_488;
  int local_47c;
  int local_478;
  int local_474;
  long *local_470;
  int local_464;
  int local_460;
  int local_45c;
  long *local_458;
  int local_44c;
  int local_448;
  int local_444;
  FabArray<amrex::FArrayBox> *local_440;
  int local_434;
  int local_430;
  int local_42c;
  FabArray<amrex::FArrayBox> *local_428;
  int local_41c;
  int local_418;
  int local_414;
  FabArray<amrex::FArrayBox> *local_410;
  int local_404;
  int local_400;
  int local_3fc;
  FabArray<amrex::FArrayBox> *local_3f8;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  FabArray<amrex::FArrayBox> *local_3e0;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  FabArray<amrex::FArrayBox> *local_3c8;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  FabArray<amrex::FArrayBox> *local_3b0;
  int local_3a4;
  int local_3a0;
  int local_39c;
  FabArray<amrex::FArrayBox> *local_398;
  int local_38c;
  int local_388;
  int local_384;
  FBData<amrex::FArrayBox> *local_380;
  int local_374;
  int local_370;
  int local_36c;
  FBData<amrex::FArrayBox> *local_368;
  double local_360;
  double local_358;
  double local_350;
  double local_348;
  GpuArray<double,_3U> *local_340;
  long *local_338;
  MFIter *local_330;
  _Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false> local_328;
  int local_320;
  int local_31c;
  int local_318;
  int local_314;
  int local_310;
  int local_30c;
  long *local_308;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  MFIter *local_2f0;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  MFIter *local_2d8;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  MFIter *local_2c0;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  MFIter *local_2a8;
  int local_29c;
  int local_298;
  int local_294;
  MFIter *local_290;
  int local_284;
  int local_280;
  int local_27c;
  MFIter *local_278;
  int local_26c;
  int local_268;
  int local_264;
  MFIter *local_260;
  int local_254;
  int local_250;
  int local_24c;
  MFIter *local_248;
  int local_23c;
  int local_238;
  int local_234;
  FBData<amrex::FArrayBox> *local_230;
  int local_224;
  int local_220;
  int local_21c;
  FBData<amrex::FArrayBox> *local_218;
  undefined4 local_20c;
  int *local_208;
  undefined4 local_1fc;
  int *local_1f8;
  undefined4 local_1ec;
  int *local_1e8;
  undefined4 local_1dc;
  int *local_1d8;
  undefined4 local_1cc;
  int *local_1c8;
  undefined4 local_1bc;
  int *local_1b8;
  undefined4 local_1ac;
  int *local_1a8;
  undefined4 local_19c;
  int *local_198;
  undefined4 local_18c;
  int *local_188;
  undefined4 local_17c;
  int *local_178;
  undefined4 local_16c;
  int *local_168;
  undefined4 local_15c;
  int *local_158;
  undefined4 local_14c;
  int *local_148;
  undefined4 local_13c;
  int *local_138;
  undefined4 local_12c;
  int *local_128;
  undefined4 local_11c;
  int *local_118;
  undefined4 local_10c;
  int *local_108;
  undefined4 local_fc;
  int *local_f8;
  undefined4 local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  Ref *local_e0;
  undefined4 local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  Ref *local_c8;
  undefined4 local_bc;
  GpuArray<double,_3U> *local_b8;
  undefined4 local_ac;
  GpuArray<double,_3U> *local_a8;
  undefined4 local_9c;
  GpuArray<double,_3U> *local_98;
  undefined4 local_8c;
  GpuArray<double,_3U> *local_88;
  undefined4 local_7c;
  GpuArray<double,_3U> *local_78;
  undefined4 local_6c;
  GpuArray<double,_3U> *local_68;
  undefined4 local_5c;
  GpuArray<double,_3U> *local_58;
  undefined4 local_4c;
  GpuArray<double,_3U> *local_48;
  undefined4 local_3c;
  GpuArray<double,_3U> *local_38;
  undefined4 local_2c;
  GpuArray<double,_3U> *local_28;
  undefined4 local_1c;
  GpuArray<double,_3U> *local_18;
  undefined4 local_c;
  GpuArray<double,_3U> *local_8;
  
  do_tiling_ = (undefined1)((ulong)in_stack_fffffffffffff4a0 >> 0x38);
  local_798 = in_RCX;
  local_790 = in_EDX;
  Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                *)in_stack_fffffffffffff480,(size_type)in_stack_fffffffffffff478);
  Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
  ::operator[]((Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                *)in_stack_fffffffffffff480,(size_type)in_stack_fffffffffffff478);
  std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
  operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL> *)
             in_stack_fffffffffffff480,(size_type)in_stack_fffffffffffff478);
  bVar2 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                          in_stack_fffffffffffff480,in_stack_fffffffffffff478);
  if (!bVar2) {
    Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                  *)in_stack_fffffffffffff480,(size_type)in_stack_fffffffffffff478);
    local_7a0 = Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                ::operator[]((Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                              *)in_stack_fffffffffffff480,(size_type)in_stack_fffffffffffff478);
    Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                  *)in_stack_fffffffffffff480,(size_type)in_stack_fffffffffffff478);
    local_7a8 = Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                              *)in_stack_fffffffffffff480,(size_type)in_stack_fffffffffffff478);
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)in_stack_fffffffffffff480,(size_type)in_stack_fffffffffffff478);
    this_00 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                        ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                         in_stack_fffffffffffff480,(size_type)in_stack_fffffffffffff478);
    CoordSys::InvCellSizeArray(&local_7c0,&this_00->super_CoordSys);
    Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                  *)in_stack_fffffffffffff480,(size_type)in_stack_fffffffffffff478);
    Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                  *)in_stack_fffffffffffff480,(size_type)in_stack_fffffffffffff478);
    local_7c8 = std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator*
                          ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                           in_stack_fffffffffffff480);
    Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
    ::operator[]((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                  *)in_stack_fffffffffffff480,(size_type)in_stack_fffffffffffff478);
    pdVar3 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff480,
                        (size_type)in_stack_fffffffffffff478);
    local_7d0 = *pdVar3;
    TilingIfNotGPU();
    MFIter::MFIter(local_798,in_stack_fffffffffffff4a8,(bool)do_tiling_);
    while (bVar2 = MFIter::isValid(&local_830), bVar2) {
      MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffff4e4,in_stack_fffffffffffff4e0));
      local_838 = local_854;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
      local_860._M_head_impl = (FBData<amrex::FArrayBox> *)local_8a0;
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((FabArray<amrex::IArrayBox> *)in_stack_fffffffffffff488,in_stack_fffffffffffff480);
      local_8a8 = local_8e8;
      if (*(int *)(in_RDI + 0x560) == 1) {
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x1590b46);
        pRVar6 = (Ref *)(local_9c8 + 0x98);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
        local_720 = local_838;
        local_158 = local_838;
        local_15c = 0;
        local_714 = *local_838;
        local_168 = local_838;
        local_16c = 1;
        iStack_710 = local_838[1];
        local_9c8._120_8_ = *(undefined8 *)local_838;
        local_178 = local_838;
        local_17c = 2;
        local_9c8._84_4_ = local_838[2];
        local_6a8 = local_838;
        local_1e8 = local_838 + 3;
        local_1ec = 0;
        local_69c = *local_1e8;
        local_1f8 = local_838 + 3;
        local_1fc = 1;
        iStack_698 = local_838[4];
        local_9c8._88_8_ = *(undefined8 *)local_1e8;
        local_208 = local_838 + 3;
        local_20c = 2;
        local_9c8._96_4_ = local_838[5];
        local_9c8._108_8_ = local_9c8._88_8_;
        local_9c8._116_4_ = local_9c8._96_4_;
        local_9c8._128_4_ = local_9c8._84_4_;
        local_9c8._136_8_ = local_9c8._120_8_;
        local_9c8._144_4_ = local_9c8._84_4_;
        local_8f0.data = pRVar6;
        local_730 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c8._120_8_;
        local_728 = local_9c8._84_4_;
        local_70c = local_9c8._84_4_;
        local_6b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9c8._88_8_;
        local_6b0 = local_9c8._96_4_;
        local_694 = local_9c8._96_4_;
        for (; (int)local_9c8._84_4_ <= (int)local_9c8._116_4_;
            local_9c8._84_4_ = local_9c8._84_4_ + 1) {
          for (local_9c8._80_4_ = local_9c8._140_4_; (int)local_9c8._80_4_ <= (int)local_9c8._112_4_
              ; local_9c8._80_4_ = local_9c8._80_4_ + 1) {
            for (local_9c8._76_4_ = local_9c8._136_4_;
                (int)local_9c8._76_4_ <= (int)local_9c8._108_4_;
                local_9c8._76_4_ = local_9c8._76_4_ + 1) {
              local_668 = local_9c8._76_4_;
              local_66c = local_9c8._80_4_;
              local_670 = local_9c8._84_4_;
              local_678 = local_860._M_head_impl;
              local_680 = local_8f0.data;
              local_688 = local_8a8;
              local_690 = local_7d0;
              local_658 = local_8a8;
              local_65c = local_9c8._76_4_;
              local_660 = local_9c8._80_4_;
              local_664 = local_9c8._84_4_;
              if (*(int *)(*local_8a8 +
                          ((long)(local_9c8._76_4_ - (int)local_8a8[4]) +
                           (long)(local_9c8._80_4_ - *(int *)((long)local_8a8 + 0x24)) *
                           local_8a8[1] +
                          (long)(local_9c8._84_4_ - (int)local_8a8[5]) * local_8a8[2]) * 4) == 0) {
                local_c8 = local_8f0.data;
                local_cc = local_9c8._76_4_;
                local_d0 = local_9c8._80_4_;
                local_d4 = local_9c8._84_4_;
                local_d8 = 0;
                std::abs(local_9c8._80_4_);
                if (local_690 < extraout_XMM0_Qa) {
                  local_e0 = local_680;
                  local_e4 = local_668;
                  local_e8 = local_66c;
                  local_ec = local_670;
                  local_f0 = 0;
                  local_640 = local_678;
                  local_644 = local_668;
                  local_648 = local_66c;
                  local_64c = local_670;
                  lVar4 = (long)(local_668 -
                                *(int *)&(local_678->recv_from).
                                         super_vector<int,_std::allocator<int>_>.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start) +
                          (long)(local_66c -
                                *(int *)((long)&(local_678->recv_from).
                                                super_vector<int,_std::allocator<int>_>.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start + 4)) *
                          *(long *)&local_678->scomp +
                          (long)(local_670 -
                                *(int *)&(local_678->recv_from).
                                         super_vector<int,_std::allocator<int>_>.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish) *
                          (long)local_678->the_recv_data;
                  *(double *)
                   (&(((FB *)(&local_678->fb->m_crse_ratio + -3))->super_CommMetaData).
                     m_threadsafe_loc + lVar4 * 8) =
                       *(double *)
                        (&(((FB *)(&local_678->fb->m_crse_ratio + -3))->super_CommMetaData).
                          m_threadsafe_loc + lVar4 * 8) /
                       *(double *)
                        ((local_680->m_pmap).super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start +
                        ((long)(local_668 -
                               *(int *)&(local_680->m_index_array).
                                        super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish) +
                         (long)(local_66c -
                               *(int *)((long)&(local_680->m_index_array).
                                               super_vector<int,_std::allocator<int>_>.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish + 4)) *
                         (long)(local_680->m_pmap).super_vector<int,_std::allocator<int>_>.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish +
                        (long)(local_670 -
                              *(int *)&(local_680->m_index_array).
                                       super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage) *
                        (long)(local_680->m_pmap).super_vector<int,_std::allocator<int>_>.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage) * 2);
                }
              }
            }
          }
        }
      }
      else if ((((*(byte *)(in_RDI + 0x641) & 1) == 0) || (local_790 < 1)) &&
              ((*(byte *)(in_RDI + 0x642) & 1) == 0)) {
        std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
        operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                    *)in_stack_fffffffffffff480,(size_type)in_stack_fffffffffffff478);
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x1592517);
        in_stack_fffffffffffff480 = &local_af0;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
        local_770 = local_838;
        local_f8 = local_838;
        local_fc = 0;
        local_764 = *local_838;
        local_108 = local_838;
        local_10c = 1;
        iStack_760 = local_838[1];
        local_780 = *(undefined8 *)local_838;
        local_118 = local_838;
        local_11c = 2;
        local_778 = local_838[2];
        local_6f8 = local_838;
        local_188 = local_838 + 3;
        local_18c = 0;
        in_stack_fffffffffffff4e4 = *local_188;
        local_198 = local_838 + 3;
        local_19c = 1;
        iStack_6e8 = local_838[4];
        local_708 = *(undefined8 *)local_188;
        local_1a8 = local_838 + 3;
        local_1ac = 2;
        local_700 = local_838[5];
        for (local_b34 = local_778; local_b38 = iStack_760,
            local_af0.local_index_map =
                 (Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff480,
            local_75c = local_778, local_6ec = in_stack_fffffffffffff4e4, local_6e4 = local_700,
            local_b34 <= local_700; local_b34 = local_b34 + 1) {
          for (; local_b3c = local_764, local_b38 <= iStack_6e8; local_b38 = local_b38 + 1) {
            for (; local_b3c <= in_stack_fffffffffffff4e4; local_b3c = local_b3c + 1) {
              local_318 = local_b3c;
              local_31c = local_b38;
              local_320 = local_b34;
              local_328._M_head_impl = local_860._M_head_impl;
              local_338 = local_8a8;
              local_340 = &local_7c0;
              local_6c = 0;
              local_7c = 0;
              local_348 = local_7c0.arr[0] * 0.027777777777777776 * local_7c0.arr[0];
              local_8c = 1;
              local_9c = 1;
              local_350 = local_7c0.arr[1] * 0.027777777777777776 * local_7c0.arr[1];
              local_ac = 2;
              local_bc = 2;
              local_358 = local_7c0.arr[2] * 0.027777777777777776 * local_7c0.arr[2];
              local_360 = local_348 + local_350 + local_358;
              local_308 = local_8a8;
              local_30c = local_b3c;
              local_310 = local_b38;
              local_314 = local_b34;
              if (*(int *)(*local_8a8 +
                          ((long)(local_b3c - (int)local_8a8[4]) +
                           (long)(local_b38 - *(int *)((long)local_8a8 + 0x24)) * local_8a8[1] +
                          (long)(local_b34 - (int)local_8a8[5]) * local_8a8[2]) * 4) == 0) {
                local_218 = local_860._M_head_impl;
                local_21c = local_b3c;
                local_220 = local_b38;
                local_224 = local_b34;
                local_24c = local_b3c + -1;
                local_250 = local_b38 + -1;
                local_254 = local_b34 + -1;
                local_268 = local_b38 + -1;
                local_26c = local_b34 + -1;
                local_264 = local_b3c;
                local_27c = local_b3c + -1;
                local_284 = local_b34 + -1;
                local_280 = local_b38;
                local_29c = local_b34 + -1;
                local_294 = local_b3c;
                local_298 = local_b38;
                local_2ac = local_b3c + -1;
                local_2b0 = local_b38 + -1;
                local_2b4 = local_b34;
                local_2c8 = local_b38 + -1;
                local_2c4 = local_b3c;
                local_2cc = local_b34;
                local_2dc = local_b3c + -1;
                local_2e0 = local_b38;
                local_2e4 = local_b34;
                local_2f4 = local_b3c;
                local_2f8 = local_b38;
                local_2fc = local_b34;
                local_230 = local_860._M_head_impl;
                local_234 = local_b3c;
                local_238 = local_b38;
                local_23c = local_b34;
                *(double *)
                 (&(((FB *)(&(local_860._M_head_impl)->fb->m_crse_ratio + -3))->super_CommMetaData).
                   m_threadsafe_loc +
                 ((long)(local_b3c -
                        *(int *)&((local_860._M_head_impl)->recv_from).
                                 super_vector<int,_std::allocator<int>_>.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) +
                  (long)(local_b38 -
                        *(int *)((long)&((local_860._M_head_impl)->recv_from).
                                        super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start + 4)) *
                  *(long *)&(local_860._M_head_impl)->scomp +
                 (long)(local_b34 -
                       *(int *)&((local_860._M_head_impl)->recv_from).
                                super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish) *
                 (long)(local_860._M_head_impl)->the_recv_data) * 8) =
                     *(double *)
                      (&(((FB *)(&(local_860._M_head_impl)->fb->m_crse_ratio + -3))->
                        super_CommMetaData).m_threadsafe_loc +
                      ((long)(local_b3c -
                             *(int *)&((local_860._M_head_impl)->recv_from).
                                      super_vector<int,_std::allocator<int>_>.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) +
                       (long)(local_b38 -
                             *(int *)((long)&((local_860._M_head_impl)->recv_from).
                                             super_vector<int,_std::allocator<int>_>.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start + 4)) *
                       *(long *)&(local_860._M_head_impl)->scomp +
                      (long)(local_b34 -
                            *(int *)&((local_860._M_head_impl)->recv_from).
                                     super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish) *
                      (long)(local_860._M_head_impl)->the_recv_data) * 8) /
                     (local_360 * -4.0 *
                     (*(double *)
                       ((long)&((in_stack_fffffffffffff480->m_fa)._M_t.
                                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                               _vptr_FabArrayBase +
                       ((long)(local_24c - in_stack_fffffffffffff480->currentIndex) +
                        (long)(local_250 - in_stack_fffffffffffff480->beginIndex) *
                        (long)in_stack_fffffffffffff480->fabArray +
                       (long)(local_254 - in_stack_fffffffffffff480->endIndex) *
                       *(long *)(in_stack_fffffffffffff480->tile_size).vect) * 8) +
                      *(double *)
                       ((long)&((in_stack_fffffffffffff480->m_fa)._M_t.
                                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                               _vptr_FabArrayBase +
                       ((long)(local_b3c - in_stack_fffffffffffff480->currentIndex) +
                        (long)(local_268 - in_stack_fffffffffffff480->beginIndex) *
                        (long)in_stack_fffffffffffff480->fabArray +
                       (long)(local_26c - in_stack_fffffffffffff480->endIndex) *
                       *(long *)(in_stack_fffffffffffff480->tile_size).vect) * 8) +
                      *(double *)
                       ((long)&((in_stack_fffffffffffff480->m_fa)._M_t.
                                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                               _vptr_FabArrayBase +
                       ((long)(local_27c - in_stack_fffffffffffff480->currentIndex) +
                        (long)(local_b38 - in_stack_fffffffffffff480->beginIndex) *
                        (long)in_stack_fffffffffffff480->fabArray +
                       (long)(local_284 - in_stack_fffffffffffff480->endIndex) *
                       *(long *)(in_stack_fffffffffffff480->tile_size).vect) * 8) +
                      *(double *)
                       ((long)&((in_stack_fffffffffffff480->m_fa)._M_t.
                                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                               _vptr_FabArrayBase +
                       ((long)(local_b3c - in_stack_fffffffffffff480->currentIndex) +
                        (long)(local_b38 - in_stack_fffffffffffff480->beginIndex) *
                        (long)in_stack_fffffffffffff480->fabArray +
                       (long)(local_29c - in_stack_fffffffffffff480->endIndex) *
                       *(long *)(in_stack_fffffffffffff480->tile_size).vect) * 8) +
                      *(double *)
                       ((long)&((in_stack_fffffffffffff480->m_fa)._M_t.
                                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                               _vptr_FabArrayBase +
                       ((long)(local_2ac - in_stack_fffffffffffff480->currentIndex) +
                        (long)(local_2b0 - in_stack_fffffffffffff480->beginIndex) *
                        (long)in_stack_fffffffffffff480->fabArray +
                       (long)(local_b34 - in_stack_fffffffffffff480->endIndex) *
                       *(long *)(in_stack_fffffffffffff480->tile_size).vect) * 8) +
                      *(double *)
                       ((long)&((in_stack_fffffffffffff480->m_fa)._M_t.
                                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                               _vptr_FabArrayBase +
                       ((long)(local_b3c - in_stack_fffffffffffff480->currentIndex) +
                        (long)(local_2c8 - in_stack_fffffffffffff480->beginIndex) *
                        (long)in_stack_fffffffffffff480->fabArray +
                       (long)(local_b34 - in_stack_fffffffffffff480->endIndex) *
                       *(long *)(in_stack_fffffffffffff480->tile_size).vect) * 8) +
                      *(double *)
                       ((long)&((in_stack_fffffffffffff480->m_fa)._M_t.
                                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                               _vptr_FabArrayBase +
                       ((long)(local_2dc - in_stack_fffffffffffff480->currentIndex) +
                        (long)(local_b38 - in_stack_fffffffffffff480->beginIndex) *
                        (long)in_stack_fffffffffffff480->fabArray +
                       (long)(local_b34 - in_stack_fffffffffffff480->endIndex) *
                       *(long *)(in_stack_fffffffffffff480->tile_size).vect) * 8) +
                     *(double *)
                      ((long)&((in_stack_fffffffffffff480->m_fa)._M_t.
                               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl)->
                              _vptr_FabArrayBase +
                      ((long)(local_b3c - in_stack_fffffffffffff480->currentIndex) +
                       (long)(local_b38 - in_stack_fffffffffffff480->beginIndex) *
                       (long)in_stack_fffffffffffff480->fabArray +
                      (long)(local_b34 - in_stack_fffffffffffff480->endIndex) *
                      *(long *)(in_stack_fffffffffffff480->tile_size).vect) * 8)));
                local_2f0 = in_stack_fffffffffffff480;
                local_2d8 = in_stack_fffffffffffff480;
                local_2c0 = in_stack_fffffffffffff480;
                local_2a8 = in_stack_fffffffffffff480;
                local_290 = in_stack_fffffffffffff480;
                local_278 = in_stack_fffffffffffff480;
                local_260 = in_stack_fffffffffffff480;
                local_248 = in_stack_fffffffffffff480;
              }
              local_330 = in_stack_fffffffffffff480;
              local_b8 = local_340;
              local_a8 = local_340;
              local_98 = local_340;
              local_88 = local_340;
              local_78 = local_340;
              local_68 = local_340;
            }
          }
        }
      }
      else {
        std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
        operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                    *)in_stack_fffffffffffff480,(size_type)in_stack_fffffffffffff478);
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x159114e);
        in_stack_fffffffffffff488 = (FabArray<amrex::FArrayBox> *)local_9c8;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
        local_9c8._64_8_ = in_stack_fffffffffffff488;
        std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
        operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                    *)in_stack_fffffffffffff480,(size_type)in_stack_fffffffffffff478);
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x1591197);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
        local_9d0 = local_a10;
        std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>::
        operator[]((array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>
                    *)in_stack_fffffffffffff480,(size_type)in_stack_fffffffffffff478);
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x15911d8);
        plVar5 = local_a58;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff488,in_stack_fffffffffffff480);
        local_748 = local_838;
        local_128 = local_838;
        local_12c = 0;
        local_73c = *local_838;
        local_138 = local_838;
        local_13c = 1;
        iStack_738 = local_838[1];
        local_a78 = *(undefined8 *)local_838;
        local_148 = local_838;
        local_14c = 2;
        local_a70 = local_838[2];
        local_6d0 = local_838;
        local_1b8 = local_838 + 3;
        local_1bc = 0;
        local_6c4 = *local_1b8;
        local_1c8 = local_838 + 3;
        local_1cc = 1;
        iStack_6c0 = local_838[4];
        local_af0.num_local_tiles = *(Vector<int,_std::allocator<int>_> **)local_1b8;
        local_1d8 = local_838 + 3;
        local_1dc = 2;
        local_a90 = local_838[5];
        for (local_af0.local_tile_index_map._4_4_ = local_a70; iVar1 = iStack_738,
            local_a84 = local_af0.num_local_tiles, local_a7c = local_a90, local_a68 = local_a78,
            local_a60 = local_a70, local_a18 = plVar5, local_758 = local_a78, local_750 = local_a70,
            local_734 = local_a70, local_6e0 = local_af0.num_local_tiles, local_6d8 = local_a90,
            local_6bc = local_a90, local_af0.local_tile_index_map._4_4_ <= local_a90;
            local_af0.local_tile_index_map._4_4_ = local_af0.local_tile_index_map._4_4_ + 1) {
          while (local_af0.local_tile_index_map._0_4_ = iVar1, iVar1 = local_73c,
                (int)local_af0.local_tile_index_map <= iStack_6c0) {
            while (local_af0.tile_array._4_4_ = iVar1, local_af0.tile_array._4_4_ <= local_6c4) {
              local_5e8 = local_af0.tile_array._4_4_;
              local_5ec = (int)local_af0.local_tile_index_map;
              local_5f0 = local_af0.local_tile_index_map._4_4_;
              local_5f8._M_head_impl = local_860._M_head_impl;
              local_600 = (FabArray<amrex::FArrayBox> *)local_9c8._64_8_;
              local_608 = local_9d0;
              local_618 = local_8a8;
              local_620 = &local_7c0;
              local_c = 0;
              local_1c = 0;
              local_628 = local_7c0.arr[0] * 0.027777777777777776 * local_7c0.arr[0];
              local_2c = 1;
              local_3c = 1;
              local_630 = local_7c0.arr[1] * 0.027777777777777776 * local_7c0.arr[1];
              local_4c = 2;
              local_5c = 2;
              local_638 = local_7c0.arr[2] * 0.027777777777777776 * local_7c0.arr[2];
              local_5d8 = local_8a8;
              local_5dc = local_af0.tile_array._4_4_;
              local_5e0 = (int)local_af0.local_tile_index_map;
              local_5e4 = local_af0.local_tile_index_map._4_4_;
              if (*(int *)(*local_8a8 +
                          ((long)(local_af0.tile_array._4_4_ - (int)local_8a8[4]) +
                           (long)((int)local_af0.local_tile_index_map -
                                 *(int *)((long)local_8a8 + 0x24)) * local_8a8[1] +
                          (long)(local_af0.local_tile_index_map._4_4_ - (int)local_8a8[5]) *
                          local_8a8[2]) * 4) == 0) {
                local_368 = local_860._M_head_impl;
                local_36c = local_af0.tile_array._4_4_;
                local_370 = (int)local_af0.local_tile_index_map;
                local_374 = local_af0.local_tile_index_map._4_4_;
                local_39c = local_af0.tile_array._4_4_ + -1;
                local_3a0 = (int)local_af0.local_tile_index_map + -1;
                local_3a4 = local_af0.local_tile_index_map._4_4_ + -1;
                local_398 = (FabArray<amrex::FArrayBox> *)local_9c8._64_8_;
                local_3b8 = (int)local_af0.local_tile_index_map + -1;
                local_3bc = local_af0.local_tile_index_map._4_4_ + -1;
                local_3b0 = (FabArray<amrex::FArrayBox> *)local_9c8._64_8_;
                local_3b4 = local_af0.tile_array._4_4_;
                local_3cc = local_af0.tile_array._4_4_ + -1;
                local_3d4 = local_af0.local_tile_index_map._4_4_ + -1;
                local_3c8 = (FabArray<amrex::FArrayBox> *)local_9c8._64_8_;
                local_3d0 = (int)local_af0.local_tile_index_map;
                local_3ec = local_af0.local_tile_index_map._4_4_ + -1;
                local_3e0 = (FabArray<amrex::FArrayBox> *)local_9c8._64_8_;
                local_3e4 = local_af0.tile_array._4_4_;
                local_3e8 = (int)local_af0.local_tile_index_map;
                local_3fc = local_af0.tile_array._4_4_ + -1;
                local_400 = (int)local_af0.local_tile_index_map + -1;
                local_3f8 = (FabArray<amrex::FArrayBox> *)local_9c8._64_8_;
                local_404 = local_af0.local_tile_index_map._4_4_;
                local_418 = (int)local_af0.local_tile_index_map + -1;
                local_410 = (FabArray<amrex::FArrayBox> *)local_9c8._64_8_;
                local_414 = local_af0.tile_array._4_4_;
                local_41c = local_af0.local_tile_index_map._4_4_;
                local_42c = local_af0.tile_array._4_4_ + -1;
                local_428 = (FabArray<amrex::FArrayBox> *)local_9c8._64_8_;
                local_430 = (int)local_af0.local_tile_index_map;
                local_434 = local_af0.local_tile_index_map._4_4_;
                local_440 = (FabArray<amrex::FArrayBox> *)local_9c8._64_8_;
                local_444 = local_af0.tile_array._4_4_;
                local_448 = (int)local_af0.local_tile_index_map;
                local_44c = local_af0.local_tile_index_map._4_4_;
                local_45c = local_af0.tile_array._4_4_ + -1;
                local_460 = (int)local_af0.local_tile_index_map + -1;
                local_464 = local_af0.local_tile_index_map._4_4_ + -1;
                local_458 = local_9d0;
                local_478 = (int)local_af0.local_tile_index_map + -1;
                local_47c = local_af0.local_tile_index_map._4_4_ + -1;
                local_470 = local_9d0;
                local_474 = local_af0.tile_array._4_4_;
                local_48c = local_af0.tile_array._4_4_ + -1;
                local_494 = local_af0.local_tile_index_map._4_4_ + -1;
                local_488 = local_9d0;
                local_490 = (int)local_af0.local_tile_index_map;
                local_4ac = local_af0.local_tile_index_map._4_4_ + -1;
                local_4a0 = local_9d0;
                local_4a4 = local_af0.tile_array._4_4_;
                local_4a8 = (int)local_af0.local_tile_index_map;
                local_4bc = local_af0.tile_array._4_4_ + -1;
                local_4c0 = (int)local_af0.local_tile_index_map + -1;
                local_4b8 = local_9d0;
                local_4c4 = local_af0.local_tile_index_map._4_4_;
                local_4d8 = (int)local_af0.local_tile_index_map + -1;
                local_4d0 = local_9d0;
                local_4d4 = local_af0.tile_array._4_4_;
                local_4dc = local_af0.local_tile_index_map._4_4_;
                local_4ec = local_af0.tile_array._4_4_ + -1;
                local_4e8 = local_9d0;
                local_4f0 = (int)local_af0.local_tile_index_map;
                local_4f4 = local_af0.local_tile_index_map._4_4_;
                local_500 = local_9d0;
                local_504 = local_af0.tile_array._4_4_;
                local_508 = (int)local_af0.local_tile_index_map;
                local_50c = local_af0.local_tile_index_map._4_4_;
                local_51c = local_af0.tile_array._4_4_ + -1;
                local_520 = (int)local_af0.local_tile_index_map + -1;
                local_524 = local_af0.local_tile_index_map._4_4_ + -1;
                local_538 = (int)local_af0.local_tile_index_map + -1;
                local_53c = local_af0.local_tile_index_map._4_4_ + -1;
                local_534 = local_af0.tile_array._4_4_;
                local_54c = local_af0.tile_array._4_4_ + -1;
                local_554 = local_af0.local_tile_index_map._4_4_ + -1;
                local_550 = (int)local_af0.local_tile_index_map;
                local_56c = local_af0.local_tile_index_map._4_4_ + -1;
                local_564 = local_af0.tile_array._4_4_;
                local_568 = (int)local_af0.local_tile_index_map;
                local_57c = local_af0.tile_array._4_4_ + -1;
                local_580 = (int)local_af0.local_tile_index_map + -1;
                local_584 = local_af0.local_tile_index_map._4_4_;
                local_598 = (int)local_af0.local_tile_index_map + -1;
                local_594 = local_af0.tile_array._4_4_;
                local_59c = local_af0.local_tile_index_map._4_4_;
                local_5ac = local_af0.tile_array._4_4_ + -1;
                local_5b0 = (int)local_af0.local_tile_index_map;
                local_5b4 = local_af0.local_tile_index_map._4_4_;
                local_5c4 = local_af0.tile_array._4_4_;
                local_5c8 = (int)local_af0.local_tile_index_map;
                local_5cc = local_af0.local_tile_index_map._4_4_;
                local_380 = local_860._M_head_impl;
                local_384 = local_af0.tile_array._4_4_;
                local_388 = (int)local_af0.local_tile_index_map;
                local_38c = local_af0.local_tile_index_map._4_4_;
                *(double *)
                 (&(((FB *)(&(local_860._M_head_impl)->fb->m_crse_ratio + -3))->super_CommMetaData).
                   m_threadsafe_loc +
                 ((long)(local_af0.tile_array._4_4_ -
                        *(int *)&((local_860._M_head_impl)->recv_from).
                                 super_vector<int,_std::allocator<int>_>.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) +
                  (long)((int)local_af0.local_tile_index_map -
                        *(int *)((long)&((local_860._M_head_impl)->recv_from).
                                        super_vector<int,_std::allocator<int>_>.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start + 4)) *
                  *(long *)&(local_860._M_head_impl)->scomp +
                 (long)(local_af0.local_tile_index_map._4_4_ -
                       *(int *)&((local_860._M_head_impl)->recv_from).
                                super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish) *
                 (long)(local_860._M_head_impl)->the_recv_data) * 8) =
                     *(double *)
                      (&(((FB *)(&(local_860._M_head_impl)->fb->m_crse_ratio + -3))->
                        super_CommMetaData).m_threadsafe_loc +
                      ((long)(local_af0.tile_array._4_4_ -
                             *(int *)&((local_860._M_head_impl)->recv_from).
                                      super_vector<int,_std::allocator<int>_>.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) +
                       (long)((int)local_af0.local_tile_index_map -
                             *(int *)((long)&((local_860._M_head_impl)->recv_from).
                                             super_vector<int,_std::allocator<int>_>.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start + 4)) *
                       *(long *)&(local_860._M_head_impl)->scomp +
                      (long)(local_af0.local_tile_index_map._4_4_ -
                            *(int *)&((local_860._M_head_impl)->recv_from).
                                     super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish) *
                      (long)(local_860._M_head_impl)->the_recv_data) * 8) /
                     ((local_638 *
                       (*(double *)
                         (*plVar5 +
                         ((long)(local_51c - (int)plVar5[4]) +
                          (long)(local_520 - *(int *)((long)plVar5 + 0x24)) * plVar5[1] +
                         (long)(local_524 - (int)plVar5[5]) * plVar5[2]) * 8) +
                        *(double *)
                         (*plVar5 +
                         ((long)(local_af0.tile_array._4_4_ - (int)plVar5[4]) +
                          (long)(local_538 - *(int *)((long)plVar5 + 0x24)) * plVar5[1] +
                         (long)(local_53c - (int)plVar5[5]) * plVar5[2]) * 8) +
                        *(double *)
                         (*plVar5 +
                         ((long)(local_54c - (int)plVar5[4]) +
                          (long)((int)local_af0.local_tile_index_map - *(int *)((long)plVar5 + 0x24)
                                ) * plVar5[1] + (long)(local_554 - (int)plVar5[5]) * plVar5[2]) * 8)
                        + *(double *)
                           (*plVar5 +
                           ((long)(local_af0.tile_array._4_4_ - (int)plVar5[4]) +
                            (long)((int)local_af0.local_tile_index_map -
                                  *(int *)((long)plVar5 + 0x24)) * plVar5[1] +
                           (long)(local_56c - (int)plVar5[5]) * plVar5[2]) * 8) +
                        *(double *)
                         (*plVar5 +
                         ((long)(local_57c - (int)plVar5[4]) +
                          (long)(local_580 - *(int *)((long)plVar5 + 0x24)) * plVar5[1] +
                         (long)(local_af0.local_tile_index_map._4_4_ - (int)plVar5[5]) * plVar5[2])
                         * 8) + *(double *)
                                 (*plVar5 +
                                 ((long)(local_af0.tile_array._4_4_ - (int)plVar5[4]) +
                                  (long)(local_598 - *(int *)((long)plVar5 + 0x24)) * plVar5[1] +
                                 (long)(local_af0.local_tile_index_map._4_4_ - (int)plVar5[5]) *
                                 plVar5[2]) * 8) +
                        *(double *)
                         (*plVar5 +
                         ((long)(local_5ac - (int)plVar5[4]) +
                          (long)((int)local_af0.local_tile_index_map - *(int *)((long)plVar5 + 0x24)
                                ) * plVar5[1] +
                         (long)(local_af0.local_tile_index_map._4_4_ - (int)plVar5[5]) * plVar5[2])
                         * 8) + *(double *)
                                 (*plVar5 +
                                 ((long)(local_af0.tile_array._4_4_ - (int)plVar5[4]) +
                                  (long)((int)local_af0.local_tile_index_map -
                                        *(int *)((long)plVar5 + 0x24)) * plVar5[1] +
                                 (long)(local_af0.local_tile_index_map._4_4_ - (int)plVar5[5]) *
                                 plVar5[2]) * 8)) +
                      local_628 *
                      (*(double *)
                        (*(long *)local_9c8._64_8_ +
                        ((long)(local_39c - *(int *)(local_9c8._64_8_ + 0x20)) +
                         (long)(local_3a0 - *(int *)(local_9c8._64_8_ + 0x24)) *
                         *(long *)&((BoxArray *)(local_9c8._64_8_ + 8))->m_bat +
                        (long)(local_3a4 - *(int *)(local_9c8._64_8_ + 0x28)) *
                        *(long *)(local_9c8._64_8_ + 0x10)) * 8) +
                       *(double *)
                        (*(long *)local_9c8._64_8_ +
                        ((long)(local_af0.tile_array._4_4_ - *(int *)(local_9c8._64_8_ + 0x20)) +
                         (long)(local_3b8 - *(int *)(local_9c8._64_8_ + 0x24)) *
                         *(long *)&((BoxArray *)(local_9c8._64_8_ + 8))->m_bat +
                        (long)(local_3bc - *(int *)(local_9c8._64_8_ + 0x28)) *
                        *(long *)(local_9c8._64_8_ + 0x10)) * 8) +
                       *(double *)
                        (*(long *)local_9c8._64_8_ +
                        ((long)(local_3cc - *(int *)(local_9c8._64_8_ + 0x20)) +
                         (long)((int)local_af0.local_tile_index_map -
                               *(int *)(local_9c8._64_8_ + 0x24)) *
                         *(long *)&((BoxArray *)(local_9c8._64_8_ + 8))->m_bat +
                        (long)(local_3d4 - *(int *)(local_9c8._64_8_ + 0x28)) *
                        *(long *)(local_9c8._64_8_ + 0x10)) * 8) +
                       *(double *)
                        (*(long *)local_9c8._64_8_ +
                        ((long)(local_af0.tile_array._4_4_ - *(int *)(local_9c8._64_8_ + 0x20)) +
                         (long)((int)local_af0.local_tile_index_map -
                               *(int *)(local_9c8._64_8_ + 0x24)) *
                         *(long *)&((BoxArray *)(local_9c8._64_8_ + 8))->m_bat +
                        (long)(local_3ec - *(int *)(local_9c8._64_8_ + 0x28)) *
                        *(long *)(local_9c8._64_8_ + 0x10)) * 8) +
                       *(double *)
                        (*(long *)local_9c8._64_8_ +
                        ((long)(local_3fc - *(int *)(local_9c8._64_8_ + 0x20)) +
                         (long)(local_400 - *(int *)(local_9c8._64_8_ + 0x24)) *
                         *(long *)&((BoxArray *)(local_9c8._64_8_ + 8))->m_bat +
                        (long)(local_af0.local_tile_index_map._4_4_ -
                              *(int *)(local_9c8._64_8_ + 0x28)) *
                        *(long *)(local_9c8._64_8_ + 0x10)) * 8) +
                       *(double *)
                        (*(long *)local_9c8._64_8_ +
                        ((long)(local_af0.tile_array._4_4_ - *(int *)(local_9c8._64_8_ + 0x20)) +
                         (long)(local_418 - *(int *)(local_9c8._64_8_ + 0x24)) *
                         *(long *)&((BoxArray *)(local_9c8._64_8_ + 8))->m_bat +
                        (long)(local_af0.local_tile_index_map._4_4_ -
                              *(int *)(local_9c8._64_8_ + 0x28)) *
                        *(long *)(local_9c8._64_8_ + 0x10)) * 8) +
                       *(double *)
                        (*(long *)local_9c8._64_8_ +
                        ((long)(local_42c - *(int *)(local_9c8._64_8_ + 0x20)) +
                         (long)((int)local_af0.local_tile_index_map -
                               *(int *)(local_9c8._64_8_ + 0x24)) *
                         *(long *)&((BoxArray *)(local_9c8._64_8_ + 8))->m_bat +
                        (long)(local_af0.local_tile_index_map._4_4_ -
                              *(int *)(local_9c8._64_8_ + 0x28)) *
                        *(long *)(local_9c8._64_8_ + 0x10)) * 8) +
                      *(double *)
                       (*(long *)local_9c8._64_8_ +
                       ((long)(local_af0.tile_array._4_4_ - *(int *)(local_9c8._64_8_ + 0x20)) +
                        (long)((int)local_af0.local_tile_index_map -
                              *(int *)(local_9c8._64_8_ + 0x24)) *
                        *(long *)&((BoxArray *)(local_9c8._64_8_ + 8))->m_bat +
                       (long)(local_af0.local_tile_index_map._4_4_ -
                             *(int *)(local_9c8._64_8_ + 0x28)) * *(long *)(local_9c8._64_8_ + 0x10)
                       ) * 8)) +
                      local_630 *
                      (*(double *)
                        (*local_9d0 +
                        ((long)(local_45c - (int)local_9d0[4]) +
                         (long)(local_460 - *(int *)((long)local_9d0 + 0x24)) * local_9d0[1] +
                        (long)(local_464 - (int)local_9d0[5]) * local_9d0[2]) * 8) +
                       *(double *)
                        (*local_9d0 +
                        ((long)(local_af0.tile_array._4_4_ - (int)local_9d0[4]) +
                         (long)(local_478 - *(int *)((long)local_9d0 + 0x24)) * local_9d0[1] +
                        (long)(local_47c - (int)local_9d0[5]) * local_9d0[2]) * 8) +
                       *(double *)
                        (*local_9d0 +
                        ((long)(local_48c - (int)local_9d0[4]) +
                         (long)((int)local_af0.local_tile_index_map -
                               *(int *)((long)local_9d0 + 0x24)) * local_9d0[1] +
                        (long)(local_494 - (int)local_9d0[5]) * local_9d0[2]) * 8) +
                       *(double *)
                        (*local_9d0 +
                        ((long)(local_af0.tile_array._4_4_ - (int)local_9d0[4]) +
                         (long)((int)local_af0.local_tile_index_map -
                               *(int *)((long)local_9d0 + 0x24)) * local_9d0[1] +
                        (long)(local_4ac - (int)local_9d0[5]) * local_9d0[2]) * 8) +
                       *(double *)
                        (*local_9d0 +
                        ((long)(local_4bc - (int)local_9d0[4]) +
                         (long)(local_4c0 - *(int *)((long)local_9d0 + 0x24)) * local_9d0[1] +
                        (long)(local_af0.local_tile_index_map._4_4_ - (int)local_9d0[5]) *
                        local_9d0[2]) * 8) +
                       *(double *)
                        (*local_9d0 +
                        ((long)(local_af0.tile_array._4_4_ - (int)local_9d0[4]) +
                         (long)(local_4d8 - *(int *)((long)local_9d0 + 0x24)) * local_9d0[1] +
                        (long)(local_af0.local_tile_index_map._4_4_ - (int)local_9d0[5]) *
                        local_9d0[2]) * 8) +
                       *(double *)
                        (*local_9d0 +
                        ((long)(local_4ec - (int)local_9d0[4]) +
                         (long)((int)local_af0.local_tile_index_map -
                               *(int *)((long)local_9d0 + 0x24)) * local_9d0[1] +
                        (long)(local_af0.local_tile_index_map._4_4_ - (int)local_9d0[5]) *
                        local_9d0[2]) * 8) +
                      *(double *)
                       (*local_9d0 +
                       ((long)(local_af0.tile_array._4_4_ - (int)local_9d0[4]) +
                        (long)((int)local_af0.local_tile_index_map -
                              *(int *)((long)local_9d0 + 0x24)) * local_9d0[1] +
                       (long)(local_af0.local_tile_index_map._4_4_ - (int)local_9d0[5]) *
                       local_9d0[2]) * 8))) * -4.0);
                local_5c0 = plVar5;
                local_5a8 = plVar5;
                local_590 = plVar5;
                local_578 = plVar5;
                local_560 = plVar5;
                local_548 = plVar5;
                local_530 = plVar5;
                local_518 = plVar5;
              }
              local_610 = plVar5;
              local_58 = local_620;
              local_48 = local_620;
              local_38 = local_620;
              local_28 = local_620;
              local_18 = local_620;
              local_8 = local_620;
              iVar1 = local_af0.tile_array._4_4_ + 1;
            }
            iVar1 = (int)local_af0.local_tile_index_map + 1;
          }
        }
      }
      MFIter::operator++(&local_830);
    }
    MFIter::~MFIter(in_stack_fffffffffffff480);
  }
  return;
}

Assistant:

void
MLNodeLaplacian::normalize (int amrlev, int mglev, MultiFab& mf) const
{
    BL_PROFILE("MLNodeLaplacian::normalize()");

    if (m_sigma[0][0][0] == nullptr) return;

    const auto& sigma = m_sigma[amrlev][mglev];
    const auto& stencil = m_stencil[amrlev][mglev];
    const auto dxinv = m_geom[amrlev][mglev].InvCellSizeArray();
    const iMultiFab& dmsk = *m_dirichlet_mask[amrlev][mglev];
    const Real s0_norm0 = m_s0_norm0[amrlev][mglev];

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && mf.isFusingCandidate()) {
        const auto& ma = mf.arrays();
        const auto& dmsk_ma = dmsk.const_arrays();

        if (m_coarsening_strategy == CoarseningStrategy::RAP)
        {
            const auto& sten_ma = stencil->const_arrays();
            ParallelFor(mf,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
            {
                mlndlap_normalize_sten(i,j,k,ma[box_no],sten_ma[box_no],dmsk_ma[box_no],s0_norm0);
            });
        }
        else if ( (m_use_harmonic_average && mglev > 0) ||
                   m_use_mapped )
        {
            AMREX_D_TERM(const auto& sx_ma = sigma[0]->const_arrays();,
                         const auto& sy_ma = sigma[1]->const_arrays();,
                         const auto& sz_ma = sigma[2]->const_arrays(););
            ParallelFor(mf,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
            {
                mlndlap_normalize_ha(i,j,k,ma[box_no],AMREX_D_DECL(sx_ma[box_no],sy_ma[box_no],sz_ma[box_no]),dmsk_ma[box_no],dxinv);
            });
        }
        else
        {
            const auto& sx_ma = sigma[0]->const_arrays();
            ParallelFor(mf,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
            {
                mlndlap_normalize_aa(i,j,k,ma[box_no],sx_ma[box_no],dmsk_ma[box_no],dxinv);
            });
        }
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& arr = mf.array(mfi);
            Array4<int const> const& dmskarr = dmsk.const_array(mfi);
            if (m_coarsening_strategy == CoarseningStrategy::RAP)
            {
                Array4<Real const> const& stenarr = stencil->const_array(mfi);

                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_normalize_sten(i,j,k,arr,stenarr,dmskarr,s0_norm0);
                });
            }
            else if ( (m_use_harmonic_average && mglev > 0) ||
                       m_use_mapped )
            {
                AMREX_D_TERM(Array4<Real const> const& sxarr = sigma[0]->const_array(mfi);,
                             Array4<Real const> const& syarr = sigma[1]->const_array(mfi);,
                             Array4<Real const> const& szarr = sigma[2]->const_array(mfi););

                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_normalize_ha(i,j,k,arr,AMREX_D_DECL(sxarr,syarr,szarr),dmskarr,dxinv);
                });
            }
            else
            {
                Array4<Real const> const& sarr = sigma[0]->const_array(mfi);

                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_normalize_aa(i,j,k,arr,sarr,dmskarr,dxinv);
                });
            }
        }
    }
}